

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O1

void __thiscall cinatra::coro_http_request::clear(coro_http_request *this)

{
  pointer __pos;
  _func_void__Op_any_ptr__Arg_ptr *p_Var1;
  
  (this->body_)._M_len = 0;
  (this->body_)._M_str = (char *)0x0;
  __pos = (this->aspect_data_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (__pos != (this->aspect_data_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->aspect_data_,__pos);
  }
  p_Var1 = (this->user_data_)._M_manager;
  if (p_Var1 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*p_Var1)(_Op_destroy,&this->user_data_,(_Arg *)0x0);
    (this->user_data_)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  return;
}

Assistant:

void clear() {
    body_ = {};
    if (!aspect_data_.empty()) {
      aspect_data_.clear();
    }
    if (user_data_.has_value()) {
      user_data_.reset();
    }
  }